

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_2::detail::
serializer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::dump(serializer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *val,bool pretty_print,bool ensure_ascii,uint indent_step,uint current_indent)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  pointer ppVar4;
  reference pbVar5;
  reference pvVar6;
  ulong uVar7;
  undefined8 uVar8;
  reference puVar9;
  reference pvVar10;
  subtype_type sVar11;
  element_type *peVar12;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  const_iterator i_5;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  const_iterator i_4;
  const_iterator cStack_c0;
  uint new_indent_2;
  __normal_iterator<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  local_b8;
  __normal_iterator<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  local_b0;
  const_iterator i_3;
  __normal_iterator<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  local_a0;
  __normal_iterator<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  local_98;
  const_iterator i_2;
  const_iterator cStack_88;
  uint new_indent_1;
  size_t local_80;
  _Self local_78;
  _Self local_70;
  ulong local_68;
  size_t cnt_1;
  const_iterator i_1;
  _Self local_48;
  _Self local_40;
  ulong local_38;
  size_t cnt;
  const_iterator i;
  uint new_indent;
  uint current_indent_local;
  uint indent_step_local;
  bool ensure_ascii_local;
  bool pretty_print_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *val_local;
  serializer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_local;
  
  i._M_node._4_4_ = current_indent;
  switch(val->m_type) {
  case null:
    peVar12 = std::
              __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"null",4);
    break;
  case object:
    bVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::empty((val->m_value).object);
    if (bVar2) {
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"{}",2);
    }
    else if (pretty_print) {
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"{\n",2);
      i._M_node._0_4_ = i._M_node._4_4_ + indent_step;
      uVar7 = std::__cxx11::string::size();
      if (uVar7 < (uint)i._M_node) {
        cVar1 = std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)&this->indent_string,cVar1 << 1);
      }
      cnt = (size_t)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    ::cbegin((val->m_value).object);
      local_38 = 0;
      while (uVar7 = local_38,
            sVar3 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    ::size((val->m_value).object), uVar7 < sVar3 - 1) {
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        uVar8 = std::__cxx11::string::c_str();
        (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,uVar8,(ulong)(uint)i._M_node);
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x22);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)&cnt);
        dump_escaped(this,&ppVar4->first,ensure_ascii);
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"\": ",3);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)&cnt);
        dump(this,&ppVar4->second,true,ensure_ascii,indent_step,(uint)i._M_node);
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,",\n",2);
        local_38 = local_38 + 1;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&cnt);
      }
      local_40._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           ::cend((val->m_value).object);
      bVar2 = std::operator!=((_Self *)&cnt,&local_40);
      if (!bVar2) {
        __assert_fail("i != val.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                      ,0x466f,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      local_48._M_node =
           (_Base_ptr)
           std::
           next<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                     ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       )cnt,1);
      i_1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::cend((val->m_value).object);
      bVar2 = std::operator==(&local_48,&i_1);
      if (!bVar2) {
        __assert_fail("std::next(i) == val.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                      ,0x4670,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      uVar8 = std::__cxx11::string::c_str();
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,uVar8,(ulong)(uint)i._M_node);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x22);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             *)&cnt);
      dump_escaped(this,&ppVar4->first,ensure_ascii);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"\": ",3);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             *)&cnt);
      dump(this,&ppVar4->second,true,ensure_ascii,indent_step,(uint)i._M_node);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,10);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      uVar8 = std::__cxx11::string::c_str();
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,uVar8,(ulong)i._M_node._4_4_);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x7d);
    }
    else {
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x7b);
      cnt_1 = (size_t)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ::cbegin((val->m_value).object);
      local_68 = 0;
      while (uVar7 = local_68,
            sVar3 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    ::size((val->m_value).object), uVar7 < sVar3 - 1) {
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x22);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)&cnt_1);
        dump_escaped(this,&ppVar4->first,ensure_ascii);
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"\":",2);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)&cnt_1);
        dump(this,&ppVar4->second,false,ensure_ascii,indent_step,i._M_node._4_4_);
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x2c);
        local_68 = local_68 + 1;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&cnt_1);
      }
      local_70._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           ::cend((val->m_value).object);
      bVar2 = std::operator!=((_Self *)&cnt_1,&local_70);
      if (!bVar2) {
        __assert_fail("i != val.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                      ,0x468b,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      local_80 = cnt_1;
      local_78._M_node =
           (_Base_ptr)
           std::
           next<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                     ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       )cnt_1,1);
      cStack_88 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                  ::cend((val->m_value).object);
      bVar2 = std::operator==(&local_78,&stack0xffffffffffffff78);
      if (!bVar2) {
        __assert_fail("std::next(i) == val.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                      ,0x468c,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x22);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             *)&cnt_1);
      dump_escaped(this,&ppVar4->first,ensure_ascii);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"\":",2);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             *)&cnt_1);
      dump(this,&ppVar4->second,false,ensure_ascii,indent_step,i._M_node._4_4_);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x7d);
    }
    break;
  case array:
    bVar2 = std::
            vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::empty((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)(val->m_value).object);
    if (bVar2) {
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"[]",2);
    }
    else if (pretty_print) {
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"[\n",2);
      i_2._M_current._4_4_ = i._M_node._4_4_ + indent_step;
      uVar7 = std::__cxx11::string::size();
      if (uVar7 < i_2._M_current._4_4_) {
        cVar1 = std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)&this->indent_string,cVar1 << 1);
      }
      local_98._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)std::
              vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::cbegin((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)(val->m_value).object);
      while( true ) {
        i_3 = std::
              vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::cend((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)(val->m_value).object);
        local_a0 = __gnu_cxx::
                   __normal_iterator<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   ::operator-(&i_3,1);
        bVar2 = __gnu_cxx::operator!=(&local_98,&local_a0);
        if (!bVar2) break;
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        uVar8 = std::__cxx11::string::c_str();
        (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,uVar8,(ulong)i_2._M_current._4_4_);
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                 ::operator*(&local_98);
        dump(this,pbVar5,true,ensure_ascii,indent_step,i_2._M_current._4_4_);
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,",\n",2);
        __gnu_cxx::
        __normal_iterator<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
        ::operator++(&local_98);
      }
      bVar2 = std::
              vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::empty((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)(val->m_value).object);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!val.m_value.array->empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                      ,0x46b5,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      uVar8 = std::__cxx11::string::c_str();
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,uVar8,(ulong)i_2._M_current._4_4_);
      pvVar6 = std::
               vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::back((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)(val->m_value).object);
      dump(this,pvVar6,true,ensure_ascii,indent_step,i_2._M_current._4_4_);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,10);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      uVar8 = std::__cxx11::string::c_str();
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,uVar8,(ulong)i._M_node._4_4_);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x5d);
    }
    else {
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x5b);
      local_b0._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)std::
              vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::cbegin((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)(val->m_value).object);
      while( true ) {
        cStack_c0 = std::
                    vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ::cend((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)(val->m_value).object);
        local_b8 = __gnu_cxx::
                   __normal_iterator<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   ::operator-(&stack0xffffffffffffff40,1);
        bVar2 = __gnu_cxx::operator!=(&local_b0,&local_b8);
        if (!bVar2) break;
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                 ::operator*(&local_b0);
        dump(this,pbVar5,false,ensure_ascii,indent_step,i._M_node._4_4_);
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x2c);
        __gnu_cxx::
        __normal_iterator<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
        ::operator++(&local_b0);
      }
      bVar2 = std::
              vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::empty((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)(val->m_value).object);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!val.m_value.array->empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                      ,0x46ca,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      pvVar6 = std::
               vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::back((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)(val->m_value).object);
      dump(this,pvVar6,false,ensure_ascii,indent_step,i._M_node._4_4_);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x5d);
    }
    break;
  case string:
    peVar12 = std::
              __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x22);
    dump_escaped(this,(string_t *)(val->m_value).object,ensure_ascii);
    peVar12 = std::
              __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x22);
    break;
  case boolean:
    if (((val->m_value).boolean & 1U) == 0) {
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"false",5);
    }
    else {
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"true",4);
    }
    break;
  case number_integer:
    dump_integer<long,_0>(this,(val->m_value).number_integer);
    break;
  case number_unsigned:
    dump_integer<unsigned_long,_0>(this,(val->m_value).number_unsigned);
    break;
  case number_float:
    dump_float(this,(val->m_value).number_float);
    break;
  case binary:
    if (pretty_print) {
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"{\n",2);
      i_4._M_current._4_4_ = i._M_node._4_4_ + indent_step;
      uVar7 = std::__cxx11::string::size();
      if (uVar7 < i_4._M_current._4_4_) {
        cVar1 = std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)&this->indent_string,cVar1 << 1);
      }
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      uVar8 = std::__cxx11::string::c_str();
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,uVar8,(ulong)i_4._M_current._4_4_);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"\"bytes\": [",10);
      bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         (val->m_value).object);
      if (!bVar2) {
        local_d0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 (val->m_value).object);
        while( true ) {
          i_5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (val->m_value).object);
          local_d8 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator-(&i_5,1);
          bVar2 = __gnu_cxx::operator!=(&local_d0,&local_d8);
          if (!bVar2) break;
          puVar9 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&local_d0);
          dump_integer<unsigned_char,_0>(this,*puVar9);
          peVar12 = std::
                    __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,", ",2);
          __gnu_cxx::
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator++(&local_d0);
        }
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (val->m_value).object);
        dump_integer<unsigned_char,_0>(this,*pvVar10);
      }
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"],\n",3);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      uVar8 = std::__cxx11::string::c_str();
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,uVar8,(ulong)i_4._M_current._4_4_);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"\"subtype\": ",0xb);
      bVar2 = byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::has_subtype((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)(val->m_value).object);
      if (bVar2) {
        sVar11 = byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::subtype((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)(val->m_value).object);
        dump_integer<unsigned_long,_0>(this,sVar11);
      }
      else {
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"null",4);
      }
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,10);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      uVar8 = std::__cxx11::string::c_str();
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,uVar8,(ulong)i._M_node._4_4_);
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x7d);
    }
    else {
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"{\"bytes\":[",10);
      bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         (val->m_value).object);
      if (!bVar2) {
        local_e8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 (val->m_value).object);
        while( true ) {
          local_f8._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   (val->m_value).object);
          local_f0 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator-(&local_f8,1);
          bVar2 = __gnu_cxx::operator!=(&local_e8,&local_f0);
          if (!bVar2) break;
          puVar9 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&local_e8);
          dump_integer<unsigned_char,_0>(this,*puVar9);
          peVar12 = std::
                    __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x2c);
          __gnu_cxx::
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator++(&local_e8);
        }
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (val->m_value).object);
        dump_integer<unsigned_char,_0>(this,*pvVar10);
      }
      peVar12 = std::
                __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"],\"subtype\":",0xc);
      bVar2 = byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::has_subtype((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)(val->m_value).object);
      if (bVar2) {
        sVar11 = byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::subtype((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)(val->m_value).object);
        dump_integer<unsigned_long,_0>(this,sVar11);
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (**peVar12->_vptr_output_adapter_protocol)(peVar12,0x7d);
      }
      else {
        peVar12 = std::
                  __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"null}",5);
      }
    }
    break;
  case discarded:
    peVar12 = std::
              __shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nlohmann::json_abi_v3_11_2::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    (*peVar12->_vptr_output_adapter_protocol[1])(peVar12,"<discarded>",0xb);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                  ,0x4750,
                  "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  return;
}

Assistant:

void dump(const BasicJsonType& val,
              const bool pretty_print,
              const bool ensure_ascii,
              const unsigned int indent_step,
              const unsigned int current_indent = 0)
    {
        switch (val.m_type)
        {
            case value_t::object:
            {
                if (val.m_value.object->empty())
                {
                    o->write_characters("{}", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\": ", 3);
                        dump(i->second, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(i != val.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_value.object->cend());
                    o->write_characters(indent_string.c_str(), new_indent);
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\": ", 3);
                    dump(i->second, true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_character('{');

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\":", 2);
                        dump(i->second, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(i != val.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_value.object->cend());
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\":", 2);
                    dump(i->second, false, ensure_ascii, indent_step, current_indent);

                    o->write_character('}');
                }

                return;
            }

            case value_t::array:
            {
                if (val.m_value.array->empty())
                {
                    o->write_characters("[]", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("[\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        dump(*i, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(!val.m_value.array->empty());
                    o->write_characters(indent_string.c_str(), new_indent);
                    dump(val.m_value.array->back(), true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character(']');
                }
                else
                {
                    o->write_character('[');

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        dump(*i, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(!val.m_value.array->empty());
                    dump(val.m_value.array->back(), false, ensure_ascii, indent_step, current_indent);

                    o->write_character(']');
                }

                return;
            }

            case value_t::string:
            {
                o->write_character('\"');
                dump_escaped(*val.m_value.string, ensure_ascii);
                o->write_character('\"');
                return;
            }

            case value_t::binary:
            {
                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"bytes\": [", 10);

                    if (!val.m_value.binary->empty())
                    {
                        for (auto i = val.m_value.binary->cbegin();
                                i != val.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_characters(", ", 2);
                        }
                        dump_integer(val.m_value.binary->back());
                    }

                    o->write_characters("],\n", 3);
                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"subtype\": ", 11);
                    if (val.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_value.binary->subtype());
                    }
                    else
                    {
                        o->write_characters("null", 4);
                    }
                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_characters("{\"bytes\":[", 10);

                    if (!val.m_value.binary->empty())
                    {
                        for (auto i = val.m_value.binary->cbegin();
                                i != val.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_character(',');
                        }
                        dump_integer(val.m_value.binary->back());
                    }

                    o->write_characters("],\"subtype\":", 12);
                    if (val.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_value.binary->subtype());
                        o->write_character('}');
                    }
                    else
                    {
                        o->write_characters("null}", 5);
                    }
                }
                return;
            }

            case value_t::boolean:
            {
                if (val.m_value.boolean)
                {
                    o->write_characters("true", 4);
                }
                else
                {
                    o->write_characters("false", 5);
                }
                return;
            }

            case value_t::number_integer:
            {
                dump_integer(val.m_value.number_integer);
                return;
            }

            case value_t::number_unsigned:
            {
                dump_integer(val.m_value.number_unsigned);
                return;
            }

            case value_t::number_float:
            {
                dump_float(val.m_value.number_float);
                return;
            }

            case value_t::discarded:
            {
                o->write_characters("<discarded>", 11);
                return;
            }

            case value_t::null:
            {
                o->write_characters("null", 4);
                return;
            }

            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
        }
    }